

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_pax_xattr_rht_security_selinux.c
# Opt level: O1

void test_read_pax_xattr_rht_security_selinux(void)

{
  int iVar1;
  wchar_t wVar2;
  archive_conflict *a;
  size_t xsize;
  void *xval;
  char *xname;
  archive_entry *ae;
  int local_50;
  undefined4 uStack_4c;
  void *local_48;
  char *local_40;
  archive_entry *local_38;
  
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_xattr_rht_security_selinux.c"
                   ,L')',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_xattr_rht_security_selinux.c"
                      ,L'*',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_xattr_rht_security_selinux.c"
                      ,L'+',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
  extract_reference_file("test_read_pax_xattr_rht_security_selinux.tar");
  wVar2 = archive_read_open_filename(a,"test_read_pax_xattr_rht_security_selinux.tar",0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_xattr_rht_security_selinux.c"
                      ,L'/',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, refname, 10240)",a);
  iVar1 = archive_read_next_header((archive *)a,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_xattr_rht_security_selinux.c"
                      ,L'1',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                      (void *)0x0);
  wVar2 = archive_entry_xattr_count(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_xattr_rht_security_selinux.c"
                      ,L'2',1,"1",(long)wVar2,"archive_entry_xattr_count(ae)",(void *)0x0);
  wVar2 = archive_entry_xattr_reset(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_xattr_rht_security_selinux.c"
                      ,L'3',1,"1",(long)wVar2,"archive_entry_xattr_reset(ae)",(void *)0x0);
  wVar2 = archive_entry_xattr_next(local_38,&local_40,&local_48,(size_t *)&local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_xattr_rht_security_selinux.c"
                      ,L'5',0,"0",(long)wVar2,"archive_entry_xattr_next(ae, &xname, &xval, &xsize)",
                      (void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_xattr_rht_security_selinux.c"
             ,L'6',local_40,"xname","security.selinux","\"security.selinux\"",(void *)0x0,L'\0');
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_xattr_rht_security_selinux.c"
                      ,L'8',local_48,"xval","system_u:object_r:admin_home_t:s0","string",
                      CONCAT44(uStack_4c,local_50),"xsize",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_xattr_rht_security_selinux.c"
                      ,L'9',(long)local_50,"(int)xsize",0x21,"strlen(string)",(void *)0x0);
  iVar1 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_xattr_rht_security_selinux.c"
                      ,L'<',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_xattr_rht_security_selinux.c"
                      ,L'=',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_pax_xattr_rht_security_selinux)
{
	struct archive *a;
	struct archive_entry *ae;
	const char *refname = "test_read_pax_xattr_rht_security_selinux.tar";
	const char *xname; /* For xattr tests. */
	const void *xval; /* For xattr tests. */
	size_t xsize; /* For xattr tests. */
	const char *string;

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));

	extract_reference_file(refname);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	assertEqualInt(ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_xattr_count(ae));
	assertEqualInt(1, archive_entry_xattr_reset(ae));

	assertEqualInt(0, archive_entry_xattr_next(ae, &xname, &xval, &xsize));
	assertEqualString(xname, "security.selinux");
	string = "system_u:object_r:admin_home_t:s0";
	assertEqualMem(xval, string, xsize);
	assertEqualInt((int)xsize, strlen(string));

	/* Close the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}